

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<c___pedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,undefined8 *params,long params_1,
          long params_2,long params_3,long params_4,long params_5,long params_6,long params_7,
          undefined8 *params_8,long params_9,undefined8 *params_10,long params_11,long params_12,
          long params_13,long params_14,long params_15,long params_16,long params_17,
          undefined8 *params_18,long params_19,undefined8 *params_20,undefined8 *params_21,
          long params_22,long params_23,long params_24,long params_25,long params_26,long params_27,
          long params_28,long params_29,long params_30,long params_31,long params_32,
          undefined8 *params_33,long params_34,long params_35,long params_36,undefined8 *params_37,
          long params_38,long params_39,long params_40,long params_41,long params_42,long params_43,
          long params_44,long params_45,long params_46,long params_47,long params_48,
          undefined8 *params_49,long params_50,long params_51,long params_52,undefined8 *params_53,
          undefined8 *params_54,long params_55,long params_56,long params_57,long params_58,
          long params_59,long params_60,long params_61,long params_62,long params_63,long params_64,
          long params_65)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t sVar3;
  long lVar4;
  Branch *pBVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  undefined8 *in_stack_000001f8;
  long in_stack_00000200;
  undefined8 *in_stack_00000208;
  undefined8 *in_stack_00000210;
  undefined8 *in_stack_00000218;
  undefined8 *in_stack_00000220;
  long in_stack_00000228;
  long in_stack_00000230;
  long in_stack_00000238;
  long in_stack_00000240;
  long in_stack_00000248;
  long in_stack_00000250;
  long in_stack_00000258;
  long in_stack_00000260;
  long in_stack_00000268;
  long in_stack_00000270;
  long in_stack_00000278;
  undefined8 *in_stack_00000280;
  long in_stack_00000288;
  undefined8 *in_stack_00000290;
  undefined8 *in_stack_00000298;
  long in_stack_000002a0;
  long in_stack_000002a8;
  long in_stack_000002b0;
  long in_stack_000002b8;
  long in_stack_000002c0;
  long in_stack_000002c8;
  long in_stack_000002d0;
  long in_stack_000002d8;
  long in_stack_000002e0;
  long in_stack_000002e8;
  long in_stack_000002f0;
  undefined8 *in_stack_000002f8;
  long in_stack_00000300;
  undefined8 *in_stack_00000308;
  undefined8 *in_stack_00000310;
  long in_stack_00000318;
  String local_3a0;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined8 local_338;
  undefined8 local_330;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined8 local_2e8;
  undefined1 local_2e0 [16];
  undefined8 local_2d0;
  long local_2c8;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined8 local_290;
  long local_288;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  long local_248;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined8 local_210;
  long local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined8 local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  undefined8 local_188;
  long local_180;
  undefined1 local_178 [16];
  undefined8 local_168;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined8 local_120;
  long local_118;
  undefined1 local_110 [16];
  undefined8 local_100;
  long local_f8;
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined8 local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined1 local_60 [16];
  undefined8 local_50;
  StringTree *local_40;
  undefined8 *local_38;
  
  lVar4 = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  lVar7 = 0;
  lVar8 = 0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  local_388._8_8_ = *params;
  local_388._0_8_ = this->size_;
  local_378._8_8_ = *(undefined8 *)(params_2 + 8);
  local_378._0_8_ = *(undefined8 *)(params_1 + 8);
  local_368._8_8_ = *(undefined8 *)(params_4 + 8);
  local_368._0_8_ = *(undefined8 *)(params_3 + 8);
  local_358._8_8_ = *(undefined8 *)(params_6 + 8);
  local_358._0_8_ = *(undefined8 *)(params_5 + 8);
  local_348._8_8_ = *params_8;
  local_348._0_8_ = *(undefined8 *)(params_7 + 8);
  local_338 = *(undefined8 *)(params_9 + 8);
  local_330 = *params_10;
  local_328._8_8_ = *(undefined8 *)(params_12 + 8);
  local_328._0_8_ = *(undefined8 *)(params_11 + 8);
  local_318._8_8_ = *(undefined8 *)(params_14 + 8);
  local_318._0_8_ = *(undefined8 *)(params_13 + 8);
  local_308._8_8_ = *(undefined8 *)(params_16 + 8);
  local_308._0_8_ = *(undefined8 *)(params_15 + 8);
  local_2f8._8_8_ = *params_18;
  local_2f8._0_8_ = *(undefined8 *)(params_17 + 8);
  local_2e8 = *(undefined8 *)(params_19 + 8);
  local_2e0._8_8_ = *params_21;
  local_2e0._0_8_ = *params_20;
  local_2d0 = *(undefined8 *)(params_22 + 8);
  local_2c8 = *(long *)(params_23 + 8) + -1;
  if (*(long *)(params_23 + 8) == 0) {
    local_2c8 = lVar4;
  }
  local_2c0._8_8_ = *(undefined8 *)(params_25 + 8);
  local_2c0._0_8_ = *(undefined8 *)(params_24 + 8);
  local_2b0._8_8_ = *(undefined8 *)(params_27 + 8);
  local_2b0._0_8_ = *(undefined8 *)(params_26 + 8);
  local_2a0._8_8_ = *(undefined8 *)(params_29 + 8);
  local_2a0._0_8_ = *(undefined8 *)(params_28 + 8);
  local_290 = *(undefined8 *)(params_30 + 8);
  local_288 = *(long *)(params_31 + 8) + -1;
  if (*(long *)(params_31 + 8) == 0) {
    local_288 = lVar4;
  }
  local_280._8_8_ = *params_33;
  local_280._0_8_ = *(undefined8 *)(params_32 + 8);
  local_270._8_8_ = *(undefined8 *)(params_35 + 8);
  local_270._0_8_ = *(undefined8 *)(params_34 + 8);
  local_260 = *(undefined8 *)(params_36 + 8);
  local_258 = *params_37;
  local_250 = *(undefined8 *)(params_38 + 8);
  local_248 = *(long *)(params_39 + 8) + -1;
  if (*(long *)(params_39 + 8) == 0) {
    local_248 = lVar4;
  }
  local_240._8_8_ = *(undefined8 *)(params_41 + 8);
  local_240._0_8_ = *(undefined8 *)(params_40 + 8);
  local_230._8_8_ = *(undefined8 *)(params_43 + 8);
  local_230._0_8_ = *(undefined8 *)(params_42 + 8);
  local_220._8_8_ = *(undefined8 *)(params_45 + 8);
  local_220._0_8_ = *(undefined8 *)(params_44 + 8);
  local_210 = *(undefined8 *)(params_46 + 8);
  local_208 = *(long *)(params_47 + 8) + -1;
  if (*(long *)(params_47 + 8) == 0) {
    local_208 = lVar4;
  }
  local_200._8_8_ = *params_49;
  local_200._0_8_ = *(undefined8 *)(params_48 + 8);
  local_1f0._8_8_ = *(undefined8 *)(params_51 + 8);
  local_1f0._0_8_ = *(undefined8 *)(params_50 + 8);
  local_1e0 = *(undefined8 *)(params_52 + 8);
  local_1d8._8_8_ = *params_54;
  local_1d8._0_8_ = *params_53;
  local_1c8._8_8_ = *(undefined8 *)(params_56 + 8);
  local_1c8._0_8_ = *(undefined8 *)(params_55 + 8);
  local_1b8._8_8_ = *(undefined8 *)(params_58 + 8);
  local_1b8._0_8_ = *(undefined8 *)(params_57 + 8);
  local_1a8 = *(undefined8 *)(params_59 + 8);
  local_1a0 = *(long *)(params_60 + 8) + -1;
  if (*(long *)(params_60 + 8) == 0) {
    local_1a0 = lVar4;
  }
  local_198._8_8_ = *(undefined8 *)(params_62 + 8);
  local_198._0_8_ = *(undefined8 *)(params_61 + 8);
  local_188 = *(undefined8 *)(params_63 + 8);
  local_180 = *(long *)(params_64 + 8) + -1;
  if (*(long *)(params_64 + 8) == 0) {
    local_180 = lVar4;
  }
  local_178._8_8_ = *in_stack_000001f8;
  local_178._0_8_ = *(undefined8 *)(params_65 + 8);
  local_168 = *(undefined8 *)(in_stack_00000200 + 8);
  local_160._8_8_ = *in_stack_00000210;
  local_160._0_8_ = *in_stack_00000208;
  local_150._8_8_ = *in_stack_00000220;
  local_150._0_8_ = *in_stack_00000218;
  local_140._8_8_ = *(undefined8 *)(in_stack_00000230 + 8);
  local_140._0_8_ = *(undefined8 *)(in_stack_00000228 + 8);
  local_130._8_8_ = *(undefined8 *)(in_stack_00000240 + 8);
  local_130._0_8_ = *(undefined8 *)(in_stack_00000238 + 8);
  local_120 = *(undefined8 *)(in_stack_00000248 + 8);
  local_118 = *(long *)(in_stack_00000250 + 8) + -1;
  if (*(long *)(in_stack_00000250 + 8) == 0) {
    local_118 = lVar4;
  }
  local_110._8_8_ = *(undefined8 *)(in_stack_00000260 + 8);
  local_110._0_8_ = *(undefined8 *)(in_stack_00000258 + 8);
  local_100 = *(undefined8 *)(in_stack_00000268 + 8);
  local_f8 = *(long *)(in_stack_00000270 + 8) + -1;
  if (*(long *)(in_stack_00000270 + 8) == 0) {
    local_f8 = lVar4;
  }
  local_f0._8_8_ = *in_stack_00000280;
  local_f0._0_8_ = *(undefined8 *)(in_stack_00000278 + 8);
  local_e0 = *(undefined8 *)(in_stack_00000288 + 8);
  local_d8._8_8_ = *in_stack_00000298;
  local_d8._0_8_ = *in_stack_00000290;
  local_c8 = *(undefined8 *)(in_stack_000002a0 + 8);
  local_c0 = *(long *)(in_stack_000002a8 + 8) + -1;
  if (*(long *)(in_stack_000002a8 + 8) == 0) {
    local_c0 = lVar4;
  }
  local_b8._8_8_ = *(undefined8 *)(in_stack_000002b8 + 8);
  local_b8._0_8_ = *(undefined8 *)(in_stack_000002b0 + 8);
  local_a8._8_8_ = *(undefined8 *)(in_stack_000002c8 + 8);
  local_a8._0_8_ = *(undefined8 *)(in_stack_000002c0 + 8);
  local_98._8_8_ = *(undefined8 *)(in_stack_000002d8 + 8);
  local_98._0_8_ = *(undefined8 *)(in_stack_000002d0 + 8);
  local_88 = *(undefined8 *)(in_stack_000002e0 + 8);
  local_80 = *(long *)(in_stack_000002e8 + 8) + -1;
  if (*(long *)(in_stack_000002e8 + 8) == 0) {
    local_80 = lVar4;
  }
  local_78._8_8_ = *in_stack_000002f8;
  local_78._0_8_ = *(undefined8 *)(in_stack_000002f0 + 8);
  local_68 = *(undefined8 *)(in_stack_00000300 + 8);
  local_60._8_8_ = *in_stack_00000310;
  local_60._0_8_ = *in_stack_00000308;
  local_50 = *(undefined8 *)(in_stack_00000318 + 8);
  do {
    lVar7 = lVar7 + *(long *)(local_388 + lVar4 * 8);
    lVar8 = lVar8 + *(long *)(local_388 + lVar4 * 8 + 8);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x68);
  __return_storage_ptr__->size_ = lVar8 + lVar7;
  lVar7 = 0;
  lVar8 = 0;
  local_388 = (undefined1  [16])0x0;
  local_378._8_8_ = *(undefined8 *)(params_2 + 8);
  local_378._0_8_ = *(undefined8 *)(params_1 + 8);
  local_368._8_8_ = *(undefined8 *)(params_4 + 8);
  local_368._0_8_ = *(undefined8 *)(params_3 + 8);
  local_358._8_8_ = *(undefined8 *)(params_6 + 8);
  local_358._0_8_ = *(undefined8 *)(params_5 + 8);
  local_348._8_8_ = *params_8;
  local_348._0_8_ = *(undefined8 *)(params_7 + 8);
  local_338 = *(undefined8 *)(params_9 + 8);
  lVar4 = 0;
  local_330 = 0;
  local_328._8_8_ = *(undefined8 *)(params_12 + 8);
  local_328._0_8_ = *(undefined8 *)(params_11 + 8);
  local_318._8_8_ = *(undefined8 *)(params_14 + 8);
  local_318._0_8_ = *(undefined8 *)(params_13 + 8);
  local_308._8_8_ = *(undefined8 *)(params_16 + 8);
  local_308._0_8_ = *(undefined8 *)(params_15 + 8);
  local_2f8._8_8_ = *params_18;
  local_2f8._0_8_ = *(undefined8 *)(params_17 + 8);
  local_2e8 = *(undefined8 *)(params_19 + 8);
  local_2e0 = (undefined1  [16])0x0;
  local_2d0 = *(undefined8 *)(params_22 + 8);
  local_2c8 = 0;
  local_2c0._8_8_ = *(undefined8 *)(params_25 + 8);
  local_2c0._0_8_ = *(undefined8 *)(params_24 + 8);
  local_2b0._8_8_ = *(undefined8 *)(params_27 + 8);
  local_2b0._0_8_ = *(undefined8 *)(params_26 + 8);
  local_2a0._8_8_ = *(undefined8 *)(params_29 + 8);
  local_2a0._0_8_ = *(undefined8 *)(params_28 + 8);
  local_290 = *(undefined8 *)(params_30 + 8);
  local_288 = 0;
  local_280._8_8_ = *params_33;
  local_280._0_8_ = *(undefined8 *)(params_32 + 8);
  local_270._8_8_ = *(undefined8 *)(params_35 + 8);
  local_270._0_8_ = *(undefined8 *)(params_34 + 8);
  local_260 = *(undefined8 *)(params_36 + 8);
  local_258 = 0;
  local_250 = *(undefined8 *)(params_38 + 8);
  local_248 = 0;
  local_240._8_8_ = *(undefined8 *)(params_41 + 8);
  local_240._0_8_ = *(undefined8 *)(params_40 + 8);
  local_230._8_8_ = *(undefined8 *)(params_43 + 8);
  local_230._0_8_ = *(undefined8 *)(params_42 + 8);
  local_220._8_8_ = *(undefined8 *)(params_45 + 8);
  local_220._0_8_ = *(undefined8 *)(params_44 + 8);
  local_210 = *(undefined8 *)(params_46 + 8);
  local_208 = 0;
  local_200._8_8_ = *params_49;
  local_200._0_8_ = *(undefined8 *)(params_48 + 8);
  local_1f0._8_8_ = *(undefined8 *)(params_51 + 8);
  local_1f0._0_8_ = *(undefined8 *)(params_50 + 8);
  local_1e0 = *(undefined8 *)(params_52 + 8);
  local_1d8 = (undefined1  [16])0x0;
  local_1c8._8_8_ = *(undefined8 *)(params_56 + 8);
  local_1c8._0_8_ = *(undefined8 *)(params_55 + 8);
  local_1b8._8_8_ = *(undefined8 *)(params_58 + 8);
  local_1b8._0_8_ = *(undefined8 *)(params_57 + 8);
  local_1a8 = *(undefined8 *)(params_59 + 8);
  local_1a0 = 0;
  local_198._8_8_ = *(undefined8 *)(params_62 + 8);
  local_198._0_8_ = *(undefined8 *)(params_61 + 8);
  local_188 = *(undefined8 *)(params_63 + 8);
  local_180 = 0;
  local_178._8_8_ = *in_stack_000001f8;
  local_178._0_8_ = *(undefined8 *)(params_65 + 8);
  local_168 = *(undefined8 *)(in_stack_00000200 + 8);
  local_160 = (undefined1  [16])0x0;
  local_150 = (undefined1  [16])0x0;
  local_140._8_8_ = *(undefined8 *)(in_stack_00000230 + 8);
  local_140._0_8_ = *(undefined8 *)(in_stack_00000228 + 8);
  local_130._8_8_ = *(undefined8 *)(in_stack_00000240 + 8);
  local_130._0_8_ = *(undefined8 *)(in_stack_00000238 + 8);
  local_120 = *(undefined8 *)(in_stack_00000248 + 8);
  local_118 = 0;
  local_110._8_8_ = *(undefined8 *)(in_stack_00000260 + 8);
  local_110._0_8_ = *(undefined8 *)(in_stack_00000258 + 8);
  local_100 = *(undefined8 *)(in_stack_00000268 + 8);
  local_f8 = 0;
  local_f0._8_8_ = *in_stack_00000280;
  local_f0._0_8_ = *(undefined8 *)(in_stack_00000278 + 8);
  local_e0 = *(undefined8 *)(in_stack_00000288 + 8);
  local_d8 = (undefined1  [16])0x0;
  local_c8 = *(undefined8 *)(in_stack_000002a0 + 8);
  local_c0 = 0;
  local_b8._8_8_ = *(undefined8 *)(in_stack_000002b8 + 8);
  local_b8._0_8_ = *(undefined8 *)(in_stack_000002b0 + 8);
  local_a8._8_8_ = *(undefined8 *)(in_stack_000002c8 + 8);
  local_a8._0_8_ = *(undefined8 *)(in_stack_000002c0 + 8);
  local_98._8_8_ = *(undefined8 *)(in_stack_000002d8 + 8);
  local_98._0_8_ = *(undefined8 *)(in_stack_000002d0 + 8);
  local_88 = *(undefined8 *)(in_stack_000002e0 + 8);
  local_80 = 0;
  local_78._8_8_ = *in_stack_000002f8;
  local_78._0_8_ = *(undefined8 *)(in_stack_000002f0 + 8);
  local_68 = *(undefined8 *)(in_stack_00000300 + 8);
  local_60 = (undefined1  [16])0x0;
  local_50 = *(undefined8 *)(in_stack_00000318 + 8);
  do {
    lVar7 = lVar7 + *(long *)(local_388 + lVar4 * 8);
    lVar8 = lVar8 + *(long *)(local_388 + lVar4 * 8 + 8);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x68);
  local_40 = this;
  local_38 = params;
  heapString(&local_3a0,lVar8 + lVar7);
  pcVar6 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar6 != (char *)0x0) {
    sVar9 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar6,1,sVar9,sVar9,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_3a0.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_3a0.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_3a0.content.disposer;
  local_388._8_8_ = 1;
  local_388._0_8_ = 1;
  lVar7 = 0;
  lVar8 = 0;
  local_378 = (undefined1  [16])0x0;
  local_368 = (undefined1  [16])0x0;
  local_358 = (undefined1  [16])0x0;
  local_348 = (undefined1  [16])0x0;
  lVar4 = 0;
  local_338 = 0;
  local_330 = 1;
  local_328 = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_2f8 = (undefined1  [16])0x0;
  local_2e8 = 0;
  local_2e0._8_8_ = 1;
  local_2e0._0_8_ = 1;
  local_2d0 = 0;
  local_2c8 = 1;
  local_2c0 = (undefined1  [16])0x0;
  local_2b0 = (undefined1  [16])0x0;
  local_2a0 = (undefined1  [16])0x0;
  local_290 = 0;
  local_288 = 1;
  local_260 = 0;
  local_270 = (undefined1  [16])0x0;
  local_280 = (undefined1  [16])0x0;
  local_258 = 1;
  local_250 = 0;
  local_248 = 1;
  local_240 = (undefined1  [16])0x0;
  local_230 = (undefined1  [16])0x0;
  local_220 = (undefined1  [16])0x0;
  local_210 = 0;
  local_208 = 1;
  local_1e0 = 0;
  local_1f0 = (undefined1  [16])0x0;
  local_200 = (undefined1  [16])0x0;
  local_1d8._8_8_ = 1;
  local_1d8._0_8_ = 1;
  local_1a8 = 0;
  local_1b8 = (undefined1  [16])0x0;
  local_1c8 = (undefined1  [16])0x0;
  local_1a0 = 1;
  local_188 = 0;
  local_198 = (undefined1  [16])0x0;
  local_180 = 1;
  local_168 = 0;
  local_178 = (undefined1  [16])0x0;
  local_160._8_8_ = 1;
  local_160._0_8_ = 1;
  local_150._8_8_ = 1;
  local_150._0_8_ = 1;
  local_120 = 0;
  local_130 = (undefined1  [16])0x0;
  local_140 = (undefined1  [16])0x0;
  local_118 = 1;
  local_100 = 0;
  local_110 = (undefined1  [16])0x0;
  local_f8 = 1;
  local_e0 = 0;
  local_f0 = (undefined1  [16])0x0;
  local_d8._8_8_ = 1;
  local_d8._0_8_ = 1;
  local_c8 = 0;
  local_c0 = 1;
  local_88 = 0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_80 = 1;
  local_68 = 0;
  local_78 = (undefined1  [16])0x0;
  local_60._8_8_ = 1;
  local_60._0_8_ = 1;
  local_50 = 0;
  do {
    lVar7 = lVar7 + *(long *)(local_388 + lVar4 * 8);
    lVar8 = lVar8 + *(long *)(local_388 + lVar4 * 8 + 8);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x68);
  sVar9 = lVar8 + lVar7;
  pBVar5 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar9,sVar9,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_3a0.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_3a0.content.ptr = (char *)pBVar5;
  local_3a0.content.size_ = sVar9;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar5;
  (__return_storage_ptr__->branches).size_ = sVar9;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pcVar6 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::Ar___pedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar6,0,local_40,local_38,params_1,params_2,params_3,params_4,
             params_5,params_6,params_7,params_8,params_9,params_10,params_11,params_12,params_13,
             params_14,params_15,params_16,params_17,params_18,params_19,params_20,params_21,
             params_22,params_23,params_24,params_25,params_26,params_27,params_28,params_29,
             params_30,params_31,params_32,params_33,params_34,params_35,params_36,params_37,
             params_38,params_39,params_40,params_41,params_42,params_43,params_44,params_45,
             params_46,params_47,params_48,params_49,params_50,params_51,params_52,params_53,
             params_54,params_55,params_56,params_57,params_58,params_59,params_60,params_61,
             params_62,params_63);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}